

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newpfor.h
# Opt level: O1

uint32_t * __thiscall
FastPForLib::NewPFor<4U,_FastPForLib::Simple16<false>_>::decodeBlock
          (NewPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,uint32_t *out,
          size_t *nvalue)

{
  pointer puVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint *puVar7;
  uint bit;
  pointer local_58;
  uint *local_50;
  ulong local_48;
  uint *local_40;
  size_t *local_38;
  
  uVar6 = *in;
  bit = uVar6 >> 0x1a;
  uVar2 = uVar6 >> 0x10 & 0x3ff;
  puVar7 = in + 1;
  uVar3 = (ulong)uVar6 & 0xffff;
  local_38 = nvalue;
  if (((uVar6 & 0xffff) != 0) &&
     (local_58 = (this->exceptions).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start, local_50 = puVar7, local_48 = uVar3,
     local_40 = puVar7, uVar2 != 0)) {
    puVar1 = local_58 + (ulong)uVar2 * 2;
    do {
      (**(code **)(Simple16<false>::unpackarray + (ulong)(*local_50 >> 0x1c) * 8))
                (&local_58,&local_50);
      uVar3 = local_48;
      puVar7 = local_40;
    } while (local_58 < puVar1);
  }
  puVar7 = puVar7 + uVar3;
  uVar6 = 0xffffffe0;
  lVar4 = 0;
  do {
    fastunpack(puVar7,(uint32_t *)((long)out + lVar4),bit);
    uVar6 = uVar6 + 0x20;
    puVar7 = (uint *)((long)puVar7 + (ulong)(bit * 4));
    lVar4 = lVar4 + 0x80;
  } while (uVar6 < 0x60);
  if (uVar2 != 0) {
    puVar1 = (this->exceptions).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar3 = 0xffffffff;
    uVar5 = 0;
    do {
      uVar3 = (ulong)(uint)((int)uVar3 + 1 + *(int *)((long)puVar1 + uVar5));
      out[uVar3] = out[uVar3] | *(int *)((long)puVar1 + uVar5 + (uVar2 << 2)) + 1 << (bit & 0x1f);
      uVar5 = uVar5 + 4;
    } while (uVar2 << 2 != uVar5);
  }
  *local_38 = lVar4 >> 2;
  return puVar7;
}

Assistant:

const uint32_t *
NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::decodeBlock(
    const uint32_t *in, uint32_t *out, size_t &nvalue) {
  const uint32_t *const initout(out);
  const uint32_t b = *in >> (32 - PFORDELTA_B);
  const size_t nExceptions = (*in >> (32 - (PFORDELTA_B + PFORDELTA_NEXCEPT))) &
                             ((1 << PFORDELTA_NEXCEPT) - 1);
  const uint32_t encodedExceptionsSize = *in & ((1 << PFORDELTA_EXCEPTSZ) - 1);

  size_t twonexceptions = 2 * nExceptions;
  ++in;
  if (encodedExceptionsSize > 0)
    ecoder.decodeArray(in, encodedExceptionsSize, &exceptions[0],
                       twonexceptions);
  assert(twonexceptions >= 2 * nExceptions);
  in += encodedExceptionsSize;

  uint32_t *beginout(out); // we use this later

  for (uint32_t j = 0; j < BlockSize; j += 32) {
    fastunpack(in, out, b);
    in += b;
    out += 32;
  }

  for (uint32_t e = 0, lpos = -1; e < nExceptions; e++) {
    lpos += exceptions[e] + 1;
    beginout[lpos] |= (exceptions[e + nExceptions] + 1) << b;
  }

  nvalue = out - initout;
  return in;
}